

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Parser_encapsulationWithNoComponentRef_Test::~Parser_encapsulationWithNoComponentRef_Test
          (Parser_encapsulationWithNoComponentRef_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, encapsulationWithNoComponentRef)
{
    const std::vector<std::string> expectedIssues = {
        "Encapsulation in model 'model_name' has an invalid child element 'component_free'.",
    };

    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <encapsulation>\n"
        "    <component_free/>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);

    EXPECT_EQ_ISSUES(expectedIssues, p);
}